

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.h
# Opt level: O0

void __thiscall Image::setPixel(Image *this,int x,int y,Vector3f *color)

{
  bool bVar1;
  reference this_00;
  Vector3f *color_local;
  int y_local;
  int x_local;
  Image *this_local;
  
  bVar1 = false;
  if (-1 < x) {
    bVar1 = x < this->_width;
  }
  if (!bVar1) {
    __assert_fail("x >= 0 && x < _width",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/Image.h"
                  ,0x23,"void Image::setPixel(int, int, const Vector3f &)");
  }
  bVar1 = false;
  if (-1 < y) {
    bVar1 = y < this->_height;
  }
  if (!bVar1) {
    __assert_fail("y >= 0 && y < _height",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/Image.h"
                  ,0x24,"void Image::setPixel(int, int, const Vector3f &)");
  }
  this_00 = std::vector<Vector3f,_std::allocator<Vector3f>_>::operator[]
                      (&this->_data,(long)(y * this->_width + x));
  Vector3f::operator=(this_00,color);
  return;
}

Assistant:

void setPixel(int x, int y, const Vector3f &color) {
        assert(x >= 0 && x < _width);
        assert(y >= 0 && y < _height);
        _data[y * _width + x] = color;
    }